

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  cmCTest *pcVar3;
  cmCTestTestProperties *pcVar4;
  char *pcVar5;
  char *__s;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  cmProcess *pcVar11;
  string *psVar12;
  pointer pbVar13;
  double testTimeOut;
  string msg;
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar9 = 0xe;
  if (total < 100) {
    lVar9 = (ulong)(9 < total) * 2 + 10;
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start ",6);
  uVar2 = this->TestHandler->MaxIndex;
  lVar9 = 3;
  if (uVar2 < 100) {
    lVar9 = 2 - (ulong)(uVar2 < 10);
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar9;
  poVar10 = (ostream *)std::ostream::operator<<(local_1a8,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(this->TestProperties->Name)._M_dataplus._M_p,
                       (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1bf,local_1f0._M_dataplus._M_p,false);
  paVar1 = &local_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  ComputeArguments(this);
  pcVar4 = this->TestProperties;
  pcVar5 = (char *)(this->TestResult).CompletionStatus._M_string_length;
  (this->TestResult).Properties = pcVar4;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  local_1d0 = &(this->TestResult).CompletionStatus;
  std::__cxx11::string::_M_replace((ulong)local_1d0,0,pcVar5,0x58f7e0);
  (this->TestResult).Status = 8;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  pcVar5 = (char *)(this->TestResult).Path._M_string_length;
  __s = (this->TestProperties->Directory)._M_dataplus._M_p;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&(this->TestResult).Path,0,pcVar5,(ulong)__s);
  pbVar13 = (pcVar4->Args).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(pcVar4->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13) < 0x21) ||
     (iVar8 = std::__cxx11::string::compare((char *)(pbVar13 + 1)), iVar8 != 0)) {
    pbVar13 = (this->TestProperties->RequiredFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar13 !=
        (this->TestProperties->RequiredFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar6 = (pbVar13->_M_dataplus)._M_p;
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,pcVar6,pcVar6 + pbVar13->_M_string_length);
        bVar7 = cmsys::SystemTools::FileExists(local_1f0._M_dataplus._M_p);
        if (!bVar7) {
          pcVar11 = (cmProcess *)operator_new(0xc0);
          cmProcess::cmProcess(pcVar11);
          this->TestProcess = pcVar11;
          poVar10 = this->TestHandler->LogFile;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"Unable to find required file: ",0x1e);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unable to find required file: ",0x1e);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                               local_1f0._M_string_length);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar3 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x1f2,(char *)local_1c8,false);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"Unable to find required file: ",&local_1f0);
          std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->TestResult).FullCommandLine,0,
                     (char *)(this->TestResult).FullCommandLine._M_string_length,0x5e12e9);
          std::__cxx11::string::_M_replace
                    ((ulong)local_1d0,0,(char *)(this->TestResult).CompletionStatus._M_string_length
                     ,0x58f85b);
          goto LAB_002e9a3d;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 !=
               (this->TestProperties->RequiredFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    iVar8 = std::__cxx11::string::compare((char *)&this->ActualCommand);
    if (iVar8 == 0) {
      pcVar11 = (cmProcess *)operator_new(0xc0);
      cmProcess::cmProcess(pcVar11);
      this->TestProcess = pcVar11;
      poVar10 = this->TestHandler->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Unable to find executable: ",0x1b)
      ;
      pbVar13 = (pcVar4->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,pbVar13[1]._M_dataplus._M_p,pbVar13[1]._M_string_length);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unable to find executable: ",0x1b);
      pbVar13 = (pcVar4->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pbVar13[1]._M_dataplus._M_p,
                           pbVar13[1]._M_string_length);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x203,local_1f0._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Unable to find executable: ",
                     (pcVar4->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&(this->TestResult).FullCommandLine,0,
                 (char *)(this->TestResult).FullCommandLine._M_string_length,0x5e12e9);
      std::__cxx11::string::_M_replace
                ((ulong)local_1d0,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                 0x58f85b);
      (this->TestResult).Status = 0;
      return false;
    }
    cmCTest::CurrentTime_abi_cxx11_((string *)local_1a8,this->CTest);
    std::__cxx11::string::operator=((string *)&this->StartTime,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    testTimeOut = ResolveTimeout(this);
    if (this->StopTimePassed == false) {
      bVar7 = ForkProcess(this,testTimeOut,this->TestProperties->ExplicitTimeout,
                          &this->TestProperties->Environment);
      return bVar7;
    }
  }
  else {
    pcVar11 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar11);
    this->TestProcess = pcVar11;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    psVar12 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
    if (psVar12->_M_string_length == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1f0,0,(char *)local_1f0._M_string_length,0x58f7f0);
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1f0,0,(char *)local_1f0._M_string_length,0x58f835);
      psVar12 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)(psVar12->_M_dataplus)._M_p);
    }
    std::__cxx11::string::append((char *)&local_1f0);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (this->TestHandler->LogFile,local_1f0._M_dataplus._M_p,
                         local_1f0._M_string_length);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1dc,(char *)local_1c8,false);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).FullCommandLine,0,
               (char *)(this->TestResult).FullCommandLine._M_string_length,0x5e12e9);
    std::__cxx11::string::_M_replace
              ((ulong)local_1d0,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
               0x58f85b);
LAB_002e9a3d:
    (this->TestResult).Status = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
  }
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2*getNumWidth(total) + 8)
    << "Start "
    << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
    << this->TestProperties->Index << ": "
    << this->TestProperties->Name << std::endl);
  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory.c_str();

  if(args.size() >= 2 && args[1] == "NOT_AVAILABLE")
    {
    this->TestProcess = new cmProcess;
    std::string msg;
    if(this->CTest->GetConfigType().empty())
      {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
      }
    else
      {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
      }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }

  // Check if all required files exist
  for(std::vector<std::string>::iterator i =
    this->TestProperties->RequiredFiles.begin();
    i != this->TestProperties->RequiredFiles.end(); ++i)
    {
    std::string file = *i;

    if(!cmSystemTools::FileExists(file.c_str()))
      {
      //Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: "
               << file << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find required file: "
               << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Not Run";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
      }
    }
  // log and return if we did not find the executable
  if (this->ActualCommand == "")
    {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: "
                   << args[1] << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find executable: "
               << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if(this->StopTimePassed)
    {
    return false;
    }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}